

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetXamlSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *srcs,string *config)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1e0;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1d8;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1d0;
  const_iterator si;
  TagVisitor<XamlTag,_cmGeneratorTarget::XamlData> visitor;
  undefined1 local_b0 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  XamlData data;
  string *config_local;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *srcs_local;
  cmGeneratorTarget *this_local;
  
  data.XamlSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)config;
  XamlData::XamlData((XamlData *)
                     &sourceFiles.
                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_b0);
  GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_b0,
                 (string *)
                 data.XamlSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  TagVisitor<XamlTag,_cmGeneratorTarget::XamlData>::TagVisitor
            ((TagVisitor<XamlTag,_cmGeneratorTarget::XamlData> *)&si,this,
             (XamlData *)
             &sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1d8._M_current =
       (cmSourceFile **)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_b0);
  __gnu_cxx::
  __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>::
  __normal_iterator<cmSourceFile**>
            ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
              *)&local_1d0,&local_1d8);
  while( true ) {
    local_1e0._M_current =
         (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_b0);
    bVar1 = __gnu_cxx::operator!=(&local_1d0,&local_1e0);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&local_1d0);
    TagVisitor<XamlTag,_cmGeneratorTarget::XamlData>::Accept
              ((TagVisitor<XamlTag,_cmGeneratorTarget::XamlData> *)&si,*ppcVar2);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&local_1d0);
  }
  TagVisitor<XamlTag,_cmGeneratorTarget::XamlData>::~TagVisitor
            ((TagVisitor<XamlTag,_cmGeneratorTarget::XamlData> *)&si);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_b0);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::operator=
            (srcs,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                  &data.ExpectedXamlSources._M_t._M_impl.super__Rb_tree_header._M_node_count);
  XamlData::~XamlData((XamlData *)
                      &sourceFiles.
                       super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmGeneratorTarget
::GetXamlSources(std::vector<cmSourceFile const*>& srcs,
                 const std::string& config) const
{
  XamlData data;
  IMPLEMENT_VISIT_IMPL(Xaml, COMMA cmGeneratorTarget::XamlData)
  srcs = data.XamlSources;
}